

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

void poly_mul_novec_aux(uint16_t *out,uint16_t *scratch,uint16_t *a,uint16_t *b,size_t n)

{
  uint16_t *n_00;
  uint16_t *n_01;
  uint16_t *a_00;
  uint16_t *b_00;
  uint16_t *scratch_00;
  ulong local_80;
  size_t i_3;
  size_t i_2;
  uint16_t *child_scratch;
  size_t i_1;
  uint16_t *b_high;
  uint16_t *a_high;
  size_t high_len;
  size_t low_len;
  size_t j;
  size_t i;
  size_t n_local;
  uint16_t *b_local;
  uint16_t *a_local;
  uint16_t *scratch_local;
  uint16_t *out_local;
  
  if (n < 0x40) {
    OPENSSL_memset(out,0,n << 2);
    for (j = 0; j < n; j = j + 1) {
      for (low_len = 0; low_len < n; low_len = low_len + 1) {
        out[j + low_len] = out[j + low_len] + a[j] * b[low_len];
      }
    }
  }
  else {
    n_00 = (uint16_t *)(n >> 1);
    n_01 = (uint16_t *)(n - (long)n_00);
    a_00 = a + (long)n_00;
    b_00 = b + (long)n_00;
    for (child_scratch = (uint16_t *)0x0; child_scratch < n_00;
        child_scratch = (uint16_t *)((long)child_scratch + 1)) {
      out[(long)child_scratch] = a_00[(long)child_scratch] + a[(long)child_scratch];
      out[(long)n_01 + (long)child_scratch] = b_00[(long)child_scratch] + b[(long)child_scratch];
    }
    if (n_01 != n_00) {
      out[(long)n_00] = a_00[(long)n_00];
      out[(long)n_01 + (long)n_00] = b_00[(long)n_00];
    }
    scratch_00 = scratch + (long)n_01 * 2;
    poly_mul_novec_aux(scratch,scratch_00,out,out + (long)n_01,(size_t)n_01);
    poly_mul_novec_aux(out + (long)n_00 * 2,scratch_00,a_00,b_00,(size_t)n_01);
    poly_mul_novec_aux(out,scratch_00,a,b,(size_t)n_00);
    for (i_3 = 0; i_3 < (ulong)((long)n_00 << 1); i_3 = i_3 + 1) {
      scratch[i_3] = scratch[i_3] - (out[i_3] + out[(long)n_00 * 2 + i_3]);
    }
    if ((n_00 != n_01) &&
       (scratch[(long)n_00 * 2] = scratch[(long)n_00 * 2] - out[(long)n_00 * 4],
       out[(long)n_00 * 4 + 1] != 0)) {
      __assert_fail("out[low_len * 4 + 1] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss.cc"
                    ,0x4d8,
                    "void poly_mul_novec_aux(uint16_t *, uint16_t *, const uint16_t *, const uint16_t *, size_t)"
                   );
    }
    for (local_80 = 0; local_80 < (ulong)((long)n_01 * 2); local_80 = local_80 + 1) {
      out[(long)n_00 + local_80] = out[(long)n_00 + local_80] + scratch[local_80];
    }
  }
  return;
}

Assistant:

static void poly_mul_novec_aux(uint16_t *out, uint16_t *scratch,
                               const uint16_t *a, const uint16_t *b, size_t n) {
  static const size_t kSchoolbookLimit = 64;
  if (n < kSchoolbookLimit) {
    OPENSSL_memset(out, 0, sizeof(uint16_t) * n * 2);
    for (size_t i = 0; i < n; i++) {
      for (size_t j = 0; j < n; j++) {
        out[i + j] += (unsigned)a[i] * b[j];
      }
    }

    return;
  }

  // Karatsuba multiplication.
  // https://en.wikipedia.org/wiki/Karatsuba_algorithm

  // When |n| is odd, the two "halves" will have different lengths. The
  // first is always the smaller.
  const size_t low_len = n / 2;
  const size_t high_len = n - low_len;
  const uint16_t *const a_high = &a[low_len];
  const uint16_t *const b_high = &b[low_len];

  for (size_t i = 0; i < low_len; i++) {
    out[i] = a_high[i] + a[i];
    out[high_len + i] = b_high[i] + b[i];
  }
  if (high_len != low_len) {
    out[low_len] = a_high[low_len];
    out[high_len + low_len] = b_high[low_len];
  }

  uint16_t *const child_scratch = &scratch[2 * high_len];
  poly_mul_novec_aux(scratch, child_scratch, out, &out[high_len], high_len);
  poly_mul_novec_aux(&out[low_len * 2], child_scratch, a_high, b_high,
                     high_len);
  poly_mul_novec_aux(out, child_scratch, a, b, low_len);

  for (size_t i = 0; i < low_len * 2; i++) {
    scratch[i] -= out[i] + out[low_len * 2 + i];
  }
  if (low_len != high_len) {
    scratch[low_len * 2] -= out[low_len * 4];
    assert(out[low_len * 4 + 1] == 0);
  }

  for (size_t i = 0; i < high_len * 2; i++) {
    out[low_len + i] += scratch[i];
  }
}